

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O3

int fl_utf_toupper(uchar *str,int len,char *buf)

{
  uint uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int l1;
  wchar_t local_3c;
  uchar *local_38;
  
  if (len < 1) {
    uVar1 = 0;
  }
  else {
    uVar6 = 0;
    uVar4 = 0;
    local_38 = str;
    do {
      uVar1 = fl_utf8decode((char *)(local_38 + uVar6),(char *)(str + len),&local_3c);
      uVar1 = Toupper(uVar1);
      wVar2 = fl_utf8encode(uVar1,buf + uVar4);
      wVar3 = local_3c;
      if (local_3c < L'\x02') {
        wVar3 = L'\x01';
      }
      uVar5 = (int)uVar6 + wVar3;
      uVar6 = (ulong)uVar5;
      if (wVar2 < L'\x02') {
        wVar2 = L'\x01';
      }
      uVar1 = (int)uVar4 + wVar2;
      uVar4 = (ulong)uVar1;
    } while ((int)uVar5 < len);
  }
  return uVar1;
}

Assistant:

int fl_utf_toupper(const unsigned char *str, int len, char *buf)
{
  int i;
  int l = 0;
  char *end = (char *)&str[len];
  for (i = 0; i < len;) {
    int l1, l2;
    unsigned int u1;

    u1 = fl_utf8decode((const char*)(str + i), end, &l1);
    l2 = fl_utf8encode((unsigned int) Toupper(u1), buf + l);
    if (l1 < 1) {
      i += 1;
    } else {
      i += l1;
    }
    if (l2 < 1) {
      l += 1;
    } else {
      l += l2;
    }
  }
  return l;
}